

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

void hunk_memdata(FILE *f,uint32_t mem,uint32_t dat)

{
  uint uVar1;
  
  uVar1 = mem & 0xfffffffe;
  if (uVar1 != 0) {
    if (uVar1 == 4) {
      dat = dat | 0x80000000;
    }
    else if (uVar1 == 2) {
      dat = dat | 0x40000000;
    }
    else {
      fwrite32be(f,dat | 0xc0000000);
      dat = mem;
    }
  }
  fwrite32be(f,dat);
  return;
}

Assistant:

static void hunk_memdata(FILE *f,uint32_t mem,uint32_t dat)
/* write a data word with memory flags, add extension word for full
   list of memory attributes, when needed (other than CHIP or FAST) */
{
  if ((mem & ~MEMF_PUBLIC) == 0) {
    fwrite32be(f,dat);
  }
  else if ((mem & ~MEMF_PUBLIC) == MEMF_CHIP) {
    fwrite32be(f,HUNKF_CHIP|dat);
  }
  else if ((mem & ~MEMF_PUBLIC) == MEMF_FAST) {
    fwrite32be(f,HUNKF_FAST|dat);
  }
  else {
    fwrite32be(f,HUNKF_FAST|HUNKF_CHIP|dat);
    fwrite32be(f,mem);
  }
}